

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueReader.hpp
# Opt level: O0

ReadResult * __thiscall binlog::detail::QueueReader::beginRead(QueueReader *this)

{
  Queue *pQVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  QueueReader *in_RSI;
  ReadResult *in_RDI;
  size_t r;
  size_t w;
  memory_order __b_1;
  memory_order __b;
  
  pQVar1 = in_RSI->_queue;
  std::operator&(memory_order_acquire,__memory_order_mask);
  uVar2 = (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i;
  pQVar1 = in_RSI->_queue;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar3 = (pQVar1->readIndex).super___atomic_base<unsigned_long>._M_i;
  in_RSI->_readEnd = uVar2;
  if (uVar2 < uVar3) {
    if (uVar3 < in_RSI->_queue->dataEnd) {
      pcVar4 = buffer(in_RSI);
      in_RDI->buffer1 = pcVar4 + uVar3;
      in_RDI->size1 = in_RSI->_queue->dataEnd - uVar3;
      pcVar4 = buffer(in_RSI);
      in_RDI->buffer2 = pcVar4;
      in_RDI->size2 = uVar2;
    }
    else {
      pcVar4 = buffer(in_RSI);
      in_RDI->buffer1 = pcVar4;
      in_RDI->size1 = uVar2;
      in_RDI->buffer2 = (char *)0x0;
      in_RDI->size2 = 0;
    }
  }
  else {
    pcVar4 = buffer(in_RSI);
    in_RDI->buffer1 = pcVar4 + uVar3;
    in_RDI->size1 = uVar2 - uVar3;
    in_RDI->buffer2 = (char *)0x0;
    in_RDI->size2 = 0;
  }
  return in_RDI;
}

Assistant:

ReadResult beginRead()
  {
    const std::size_t w = _queue->writeIndex.load(std::memory_order_acquire);
    const std::size_t r = _queue->readIndex.load(std::memory_order_relaxed);

    _readEnd = w;

    if (r <= w)  // [...R######W...]
    {
      return ReadResult{buffer() + r, w - r, nullptr, 0};
    }

    if (r < _queue->dataEnd)  // [###W...R###E..]
    {
      return ReadResult{
        buffer() + r, _queue->dataEnd - r,
        buffer(), w
      };
    }

    // [###W......RE..]
    return ReadResult{buffer(), w, nullptr, 0};
  }